

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O1

AbstractionResult * __thiscall
Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>
          (AbstractionResult *__return_storage_ptr__,Kernel *this,TermSpec *au,TermSpec *t1)

{
  RationalConstantType *r;
  RobSubstitution *pRVar1;
  uint64_t uVar2;
  Term *this_00;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppVar3;
  _Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  this_01;
  UnificationConstraint *pUVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_RobSubstitution_hpp:119:60),_Kernel::TermSpec>_>
  it;
  Stack<Kernel::TermSpec> *pSVar9;
  Stack<Kernel::UnificationConstraint> *pSVar10;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
  *pDVar11;
  undefined8 uVar12;
  Self SVar13;
  Self SVar14;
  Self SVar15;
  Self SVar16;
  bool bVar17;
  uint functor;
  uint functor_00;
  int iVar18;
  pointer __p;
  TermSpec *pTVar19;
  TermList TVar20;
  long lVar21;
  Kernel *pKVar22;
  Entry *pEVar23;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *pRVar24;
  UnificationConstraint *pUVar25;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *siglen;
  uchar *sig_00;
  ulong uVar26;
  ulong uVar27;
  EVP_PKEY_CTX *ctx;
  EqualIf *this_02;
  uchar *tbs;
  int iVar28;
  Kernel *pKVar29;
  Kernel *pKVar30;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppVar31;
  _Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> stack;
  long lVar32;
  ulong uVar33;
  TermSpec TVar34;
  TermSpec args;
  TermSpec outer;
  TermSpec args_1;
  AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_> sig;
  anon_class_8_1_15ee404b equalIf;
  anon_class_56_7_29367afc curSumCanUnify;
  anon_class_16_2_625a7563 rest;
  RationalConstantType num;
  anon_class_8_1_3fcf64f2 cTerm;
  Option<unsigned_long> idx;
  Numeral curSum;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  curNegSummands;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  curPosSummands;
  anon_class_8_1_ba1d7831 constraint;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  constr;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  unify;
  anon_class_16_2_6c5ac959 toConstr;
  anon_class_16_2_0971476b sum;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  _diff;
  undefined1 local_381;
  AbstractionResult *local_380;
  Kernel *local_378;
  undefined1 local_370 [8];
  undefined1 local_368 [23];
  undefined1 uStack_351;
  undefined7 uStack_350;
  undefined1 uStack_349;
  undefined7 uStack_348;
  undefined1 uStack_341;
  undefined7 uStack_340;
  undefined1 uStack_339;
  undefined7 uStack_338;
  undefined1 uStack_331;
  undefined1 local_328 [16];
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_318;
  undefined1 local_308 [39];
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *local_2e1;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppStack_2d9;
  Kernel *local_2d0;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_2c8;
  _Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> local_2b8;
  EqualIf local_2a0;
  __uniq_ptr_impl<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
  local_280;
  __mpz_struct local_270;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_260;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_250;
  undefined1 *local_240;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_238;
  EqualIf local_228;
  undefined4 uStack_208;
  ulong local_200;
  undefined4 uStack_1f8;
  uint64_t local_1f0;
  undefined4 uStack_1e8;
  _Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> local_1e0;
  Kernel *local_1d8;
  Kernel *local_1d0;
  EqualIf local_1c8;
  undefined1 **local_1a8;
  Kernel ***local_1a0;
  TermSpec *local_198;
  undefined8 uStack_190;
  uint local_188;
  undefined4 uStack_184;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_180;
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_170;
  EqualIf local_160;
  Kernel **local_140;
  undefined1 *local_138;
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_130;
  EqualIf local_120;
  EqualIf local_100;
  EqualIf local_e0;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> local_c0;
  UnificationConstraint local_90;
  UnificationConstraint local_60;
  
  local_370 = (undefined1  [8])&local_228._constr;
  local_228._constr._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._0_1_ = 0;
  local_240 = &local_381;
  local_380 = __return_storage_ptr__;
  local_2d0 = this;
  if (((au->term)._content & 3) == 0) {
    pRVar1 = *(RobSubstitution **)this;
    TVar34 = TermSpec::sort(au);
    local_368._0_7_ = (undefined7)TVar34.term._content;
    local_368[7] = TVar34.term._content._7_1_;
    local_368._8_4_ = TVar34.index;
    pTVar19 = RobSubstitution::derefBound(pRVar1,(TermSpec *)local_368);
    uVar26 = (pTVar19->term)._content;
    if ((uVar26 & 1) == 0) {
      if (AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT == '\0') {
        DAT_00b77c80 = AtomicSort::rationalSort();
        AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT = '\x01';
      }
      if (uVar26 != DAT_00b77c80._content) goto LAB_00618ad6;
    }
    else {
      local_378 = (Kernel *)CONCAT44(local_378._4_4_,pTVar19->index);
      if (AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT == '\0') {
        DAT_00b77c80 = AtomicSort::rationalSort();
        AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT = '\x01';
      }
      uVar27 = DAT_00b77c80._content;
      local_368._0_7_ = (undefined7)DAT_00b77c80._content;
      local_368[7] = (undefined1)(DAT_00b77c80._content >> 0x38);
      if (((DAT_00b77c80._content & 3) == 0) && ((*(byte *)(DAT_00b77c80._content + 0x28) & 8) != 0)
         ) {
        TermList::ground((TermList *)local_368);
      }
      local_1f0 = (uint64_t)AtomicSort::superSort();
      local_368._0_7_ = (undefined7)local_1f0;
      local_368[7] = (undefined1)(local_1f0 >> 0x38);
      if (((local_1f0 & 3) == 0) && ((*(byte *)(local_1f0 + 0x28) & 8) != 0)) {
        TermList::ground((TermList *)local_368);
      }
      uStack_208 = local_378._0_4_;
      local_200 = uVar27;
      uStack_1f8 = 0;
      uStack_1e8 = 0;
      local_228._constr._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._0_1_
           = 1;
      local_228._constr._8_8_ = uVar26;
    }
  }
  if (((t1->term)._content & 3) == 0) {
    pRVar1 = *(RobSubstitution **)this;
    TVar34 = TermSpec::sort(t1);
    local_368._0_7_ = (undefined7)TVar34.term._content;
    local_368[7] = TVar34.term._content._7_1_;
    local_368._8_4_ = TVar34.index;
    pTVar19 = RobSubstitution::derefBound(pRVar1,(TermSpec *)local_368);
    uVar26 = (pTVar19->term)._content;
    if ((uVar26 & 1) == 0) {
      if (AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT == '\0') {
        DAT_00b77c80 = AtomicSort::rationalSort();
        AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT = '\x01';
      }
      if (uVar26 != DAT_00b77c80._content) {
LAB_00618ad6:
        pDVar11 = &(local_380->_inner).
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xf] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x10] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x11] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x12] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x13] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x14] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x15] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x16] = '\0';
        pDVar11 = &(local_380->_inner).
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x17] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x18] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x19] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1a] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1b] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1c] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1d] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1e] = '\0';
        *(undefined8 *)
         &(local_380->_inner).
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          .
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
             = 0;
        pDVar11 = &(local_380->_inner).
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[7] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[8] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[9] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[10] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xb] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xc] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xd] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xe] = '\0';
        *(undefined4 *)
         ((local_380->_inner).
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          .
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          ._content + 0x1f) = 0;
        return local_380;
      }
    }
    else {
      local_378 = (Kernel *)CONCAT44(local_378._4_4_,pTVar19->index);
      if (AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT == '\0') {
        DAT_00b77c80 = AtomicSort::rationalSort();
        AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>::sortT = '\x01';
      }
      uVar27 = DAT_00b77c80._content;
      local_368._0_7_ = (undefined7)DAT_00b77c80._content;
      local_368[7] = (undefined1)(DAT_00b77c80._content >> 0x38);
      if (((DAT_00b77c80._content & 3) == 0) && ((*(byte *)(DAT_00b77c80._content + 0x28) & 8) != 0)
         ) {
        TermList::ground((TermList *)local_368);
      }
      TVar20 = AtomicSort::superSort();
      local_368._0_7_ = (undefined7)TVar20._content;
      local_368[7] = (undefined1)(TVar20._content >> 0x38);
      if (((TVar20._content & 3) == 0) && ((*(byte *)(TVar20._content + 0x28) & 8) != 0)) {
        TermList::ground((TermList *)local_368);
      }
      uStack_208 = local_378._0_4_;
      local_200 = uVar27;
      uStack_1f8 = 0;
      uStack_1e8 = 0;
      local_228._constr._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._0_1_
           = 1;
      local_228._constr._8_8_ = uVar26;
      local_1f0 = TVar20._content;
    }
  }
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_130);
  functor = NumTraits<Kernel::RationalConstantType>::addF();
  functor_00 = AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>::minusF();
  uVar5 = au->term;
  uVar6 = au->index;
  TVar34.index = uVar6;
  TVar34.term._content = uVar5;
  TVar34._12_4_ = 0;
  TVar34 = RobSubstitution::createTerm<Kernel::TermSpec>
                     (*(RobSubstitution **)local_2d0,functor_00,TVar34);
  args._8_8_ = TVar34._8_8_ & 0xffffffff;
  tbs = (uchar *)(t1->term)._content;
  uVar7 = t1->term;
  uVar8 = t1->index;
  args.term._content = TVar34.term._content._content;
  args_1._12_4_ = 0;
  args_1.term._content = uVar7;
  args_1.index = uVar8;
  uVar26 = (ulong)(uint)uVar8;
  TVar34 = RobSubstitution::createTerm<Kernel::TermSpec,Kernel::TermSpec>
                     (*(RobSubstitution **)local_2d0,functor,args,args_1);
  outer._12_4_ = 0;
  outer.term._content = SUB128(TVar34._0_12_,0);
  outer.index = SUB124(TVar34._0_12_,8);
  TVar34 = norm(outer,(AbstractingUnifier *)this);
  iterAtoms<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1,auto:2)_2_>
            (TVar34.term._content._content,TVar34.index,this,
             local_130._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl);
  pUVar25 = *(UnificationConstraint **)
             ((long)local_130._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                    .
                    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                    ._M_head_impl + 8);
  lVar21 = (long)*(UnificationConstraint **)
                  ((long)local_130._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                         .
                         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                         ._M_head_impl + 0x10) - (long)pUVar25 >> 4;
  pKVar29 = (Kernel *)0xffffffffffffffff;
  do {
    pKVar30 = (Kernel *)(lVar21 * -0x5555555555555555);
    if (pKVar29 + lVar21 * 0x5555555555555555 == (Kernel *)0xffffffffffffffff) break;
    pKVar30 = pKVar29 + 1;
    pTVar19 = &pUVar25->_t1;
    pUVar25 = pUVar25 + 1;
    pKVar29 = pKVar30;
  } while (((pTVar19->term)._content & 1) != 0);
  local_140 = &local_2d0;
  local_1a0 = &local_140;
  local_138 = &local_381;
  local_1a8 = &local_240;
  lVar21 = ((long)*(UnificationConstraint **)
                   ((long)local_130._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                          ._M_head_impl + 0x10) -
            (long)*(UnificationConstraint **)
                   ((long)local_130._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                          .
                          super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                          ._M_head_impl + 8) >> 4) * -0x5555555555555555;
  local_368._8_4_ = 0;
  local_368._12_4_ = 0;
  local_368._16_7_ = 0;
  uStack_351 = 0;
  uStack_350 = (undefined7)lVar21;
  uStack_349 = (undefined1)((ulong)lVar21 >> 0x38);
  local_368._0_7_ =
       local_130._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
       .
       super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
       ._M_head_impl._0_7_;
  local_368[7] = local_130._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                 .
                 super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                 ._M_head_impl._7_1_;
  bVar17 = ::Lib::
           IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<std::pair<Kernel::TermSpec,Kernel::RationalConstantType>>,unsigned_long>(Lib::Stack<std::pair<Kernel::TermSpec,Kernel::RationalConstantType>>&,unsigned_long)::{lambda(auto:1)#1},std::pair<Kernel::TermSpec,Kernel::RationalConstantType>&>>
           ::
           any<Kernel::alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)::_lambda(auto:1&)_2_>
                     ();
  if (bVar17) {
    if (*(char *)&(((Self *)local_370)->_M_t).
                  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> ==
        '\x01') {
      AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_308);
      if (*(char *)&(((Self *)local_370)->_M_t).
                    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> ==
          '\x01') {
        *(char *)&(((Self *)local_370)->_M_t).
                  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> = '\0';
        ppVar31 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)((long)local_370 + 8);
        uStack_341 = SUB81(((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                           ((long)local_370 + 0x20))->_stack,0);
        uStack_340 = (undefined7)
                     ((ulong)((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                             ((long)local_370 + 0x20))->_stack >> 8);
        uStack_339 = SUB81(((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                           ((long)local_370 + 0x20))->_cursor,0);
        uStack_338 = (undefined7)
                     ((ulong)((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                             ((long)local_370 + 0x20))->_cursor >> 8);
        uStack_351 = SUB81(*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                            ((long)local_370 + 0x18),0);
        uStack_350 = (undefined7)
                     ((ulong)*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                              ((long)local_370 + 0x18) >> 8);
        uStack_349 = (undefined1)
                     ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                     ((long)local_370 + 0x20))->_capacity;
        uStack_348 = (undefined7)
                     (((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                      ((long)local_370 + 0x20))->_capacity >> 8);
        local_368[7] = SUB81(ppVar31,0);
        local_368._8_4_ = (undefined4)((ulong)ppVar31 >> 8);
        local_368._12_3_ = (undefined3)((ulong)ppVar31 >> 0x28);
        local_368[0xf] =
             SUB81(*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                    ((long)local_370 + 0x10),0);
        local_368._16_7_ =
             (undefined7)
             ((ulong)*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                      ((long)local_370 + 0x10) >> 8);
      }
      else {
        *(char *)&(((Self *)local_370)->_M_t).
                  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> = '\0';
      }
      pSVar10 = (Stack<Kernel::UnificationConstraint> *)CONCAT17(local_308[7],local_308._0_7_);
      ::Lib::Stack<Kernel::UnificationConstraint>::reserve
                (pSVar10,((long)pSVar10->_cursor - (long)pSVar10->_stack >> 4) * -0x5555555555555555
                         + 1);
      if (pSVar10->_cursor == pSVar10->_end) {
        ::Lib::Stack<Kernel::UnificationConstraint>::expand(pSVar10);
      }
      pUVar25 = pSVar10->_cursor;
      (pUVar25->_sort).term._content = CONCAT71(uStack_340,uStack_341);
      *(ulong *)&(pUVar25->_sort).index = CONCAT71(uStack_338,uStack_339);
      (pUVar25->_t2).term._content = CONCAT71(uStack_350,uStack_351);
      *(ulong *)&(pUVar25->_t2).index = CONCAT71(uStack_348,uStack_349);
      (pUVar25->_t1).term._content =
           CONCAT35(local_368._12_3_,CONCAT41(local_368._8_4_,local_368[7]));
      *(ulong *)&(pUVar25->_t1).index = CONCAT71(local_368._16_7_,local_368[0xf]);
      pSVar10->_cursor = pSVar10->_cursor + 1;
      local_328[7] = local_308[7];
      local_328._0_7_ = local_308._0_7_;
      local_318._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._7_1_
           = local_308[0x17];
      local_318._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._0_7_
           = local_308._16_7_;
      local_308._0_7_ = 0;
      local_308[7] = 0;
      local_308._16_7_ = 0;
      local_308[0x17] = 0;
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)(local_308 + 0x10));
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)local_308);
    }
    else {
      AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_328);
    }
    alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
    ::{lambda(auto:1&)#1}::operator()
              (&local_60,(_lambda_auto_1___1_ *)&local_1a8,
               (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
               local_130._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
               ._M_head_impl);
    SVar13._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )local_318._self;
    uStack_348 = (undefined7)local_60._sort.term._content;
    uStack_341 = (undefined1)(local_60._sort.term._content >> 0x38);
    uStack_340 = local_60._sort._8_7_;
    uStack_339 = local_60._sort._15_1_;
    local_368._16_7_ = (undefined7)local_60._t2.term._content;
    uStack_351 = (undefined1)(local_60._t2.term._content >> 0x38);
    uStack_350 = local_60._t2._8_7_;
    uStack_349 = local_60._t2._15_1_;
    local_368._0_7_ = (undefined7)local_60._t1.term._content;
    local_368[7] = (undefined1)(local_60._t1.term._content >> 0x38);
    local_368._8_4_ = local_60._t1.index;
    local_368._12_4_ = local_60._t1._12_4_;
    ::Lib::Stack<Kernel::UnificationConstraint>::reserve
              ((Stack<Kernel::UnificationConstraint> *)
               local_318._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
               _M_head_impl,
               ((long)*(UnificationConstraint **)
                       ((long)local_318._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                              .
                              super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                              ._M_head_impl + 0x10) -
                (long)*(UnificationConstraint **)
                       ((long)local_318._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                              .
                              super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                              ._M_head_impl + 8) >> 4) * -0x5555555555555555 + 1);
    if (*(UnificationConstraint **)
         ((long)SVar13._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                _M_head_impl + 0x10) ==
        *(UnificationConstraint **)
         ((long)SVar13._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                _M_head_impl + 0x18)) {
      ::Lib::Stack<Kernel::UnificationConstraint>::expand
                ((Stack<Kernel::UnificationConstraint> *)
                 SVar13._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                 _M_head_impl);
    }
    pUVar25 = *(UnificationConstraint **)
               ((long)SVar13._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                      _M_head_impl + 0x10);
    (pUVar25->_sort).term._content = CONCAT17(uStack_341,uStack_348);
    *(ulong *)&(pUVar25->_sort).index = CONCAT17(uStack_339,uStack_340);
    (pUVar25->_t2).term._content = CONCAT17(uStack_351,local_368._16_7_);
    *(ulong *)&(pUVar25->_t2).index = CONCAT17(uStack_349,uStack_350);
    (pUVar25->_t1).term._content = CONCAT17(local_368[7],local_368._0_7_);
    *(ulong *)&(pUVar25->_t1).index = CONCAT44(local_368._12_4_,local_368._8_4_);
    *(UnificationConstraint **)
     ((long)SVar13._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
     + 0x10) = *(UnificationConstraint **)
                ((long)SVar13._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                       _M_head_impl + 0x10) + 1;
    local_e0._unify._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )local_328._0_8_;
    local_328._0_8_ =
         (__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          )0x0;
    local_e0._constr._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
         local_318._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
         .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
    local_318._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
          )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            )0x0;
    ::Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
    Coproduct<Kernel::AbstractionOracle::EqualIf,_0>(local_380,&local_e0);
    ::Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_e0._constr);
    ::Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_e0._unify);
    ::Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_318);
    this_02 = (EqualIf *)local_328;
  }
  else if (*(UnificationConstraint **)
            ((long)local_130._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                   ._M_head_impl + 0x10) ==
           *(UnificationConstraint **)
            ((long)local_130._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                   .
                   super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                   ._M_head_impl + 8)) {
    if (*(char *)&(((Self *)local_370)->_M_t).
                  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> ==
        '\x01') {
      AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_308);
      if (*(char *)&(((Self *)local_370)->_M_t).
                    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> ==
          '\x01') {
        *(char *)&(((Self *)local_370)->_M_t).
                  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> = '\0';
        ppVar31 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)((long)local_370 + 8);
        uStack_341 = SUB81(((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                           ((long)local_370 + 0x20))->_stack,0);
        uStack_340 = (undefined7)
                     ((ulong)((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                             ((long)local_370 + 0x20))->_stack >> 8);
        uStack_339 = SUB81(((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                           ((long)local_370 + 0x20))->_cursor,0);
        uStack_338 = (undefined7)
                     ((ulong)((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                             ((long)local_370 + 0x20))->_cursor >> 8);
        uStack_351 = SUB81(*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                            ((long)local_370 + 0x18),0);
        uStack_350 = (undefined7)
                     ((ulong)*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                              ((long)local_370 + 0x18) >> 8);
        uStack_349 = (undefined1)
                     ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                     ((long)local_370 + 0x20))->_capacity;
        uStack_348 = (undefined7)
                     (((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                      ((long)local_370 + 0x20))->_capacity >> 8);
        local_368[7] = SUB81(ppVar31,0);
        local_368._8_4_ = (undefined4)((ulong)ppVar31 >> 8);
        local_368._12_3_ = (undefined3)((ulong)ppVar31 >> 0x28);
        local_368[0xf] =
             SUB81(*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                    ((long)local_370 + 0x10),0);
        local_368._16_7_ =
             (undefined7)
             ((ulong)*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                      ((long)local_370 + 0x10) >> 8);
      }
      else {
        *(char *)&(((Self *)local_370)->_M_t).
                  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> = '\0';
      }
      pSVar10 = (Stack<Kernel::UnificationConstraint> *)CONCAT17(local_308[7],local_308._0_7_);
      ::Lib::Stack<Kernel::UnificationConstraint>::reserve
                (pSVar10,((long)pSVar10->_cursor - (long)pSVar10->_stack >> 4) * -0x5555555555555555
                         + 1);
      if (pSVar10->_cursor == pSVar10->_end) {
        ::Lib::Stack<Kernel::UnificationConstraint>::expand(pSVar10);
      }
      pUVar25 = pSVar10->_cursor;
      (pUVar25->_sort).term._content = CONCAT71(uStack_340,uStack_341);
      *(ulong *)&(pUVar25->_sort).index = CONCAT71(uStack_338,uStack_339);
      (pUVar25->_t2).term._content = CONCAT71(uStack_350,uStack_351);
      *(ulong *)&(pUVar25->_t2).index = CONCAT71(uStack_348,uStack_349);
      (pUVar25->_t1).term._content =
           CONCAT35(local_368._12_3_,CONCAT41(local_368._8_4_,local_368[7]));
      *(ulong *)&(pUVar25->_t1).index = CONCAT71(local_368._16_7_,local_368[0xf]);
      pSVar10->_cursor = pSVar10->_cursor + 1;
      local_308._0_7_ = 0;
      local_308[7] = 0;
      local_308._16_7_ = 0;
      local_308[0x17] = 0;
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)(local_308 + 0x10));
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)local_308);
    }
    else {
      AbstractionOracle::EqualIf::EqualIf(&local_1c8);
    }
    ::Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
    Coproduct<Kernel::AbstractionOracle::EqualIf,_0>(local_380,&local_1c8);
    ::Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_1c8._constr);
    this_02 = &local_1c8;
  }
  else {
    if (pKVar30 != (Kernel *)0x0) {
      ::Lib::
      Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)&local_280);
      local_1d8 = (Kernel *)
                  (((long)*(UnificationConstraint **)
                           ((long)local_130._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                  ._M_head_impl + 0x10) -
                    (long)*(UnificationConstraint **)
                           ((long)local_130._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                  ._M_head_impl + 8) >> 4) * -0x5555555555555555);
      stack._M_head_impl = (Stack<Kernel::UnificationConstraint> *)local_130._self;
      if (pKVar30 < local_1d8) {
        pKVar22 = pKVar30 + (pKVar30 < local_1d8);
        local_1e0._M_head_impl =
             (Stack<Kernel::UnificationConstraint> *)
             local_130._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
             ._M_head_impl;
        pKVar29 = pKVar30;
        do {
          local_378 = pKVar29;
          local_1d0 = pKVar22;
          ::Lib::Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::Recycled((Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      *)local_368);
          pSVar9 = (Stack<Kernel::TermSpec> *)CONCAT17(local_368[7],local_368._0_7_);
          uVar2 = (*(UnificationConstraint **)((long)stack._M_head_impl + 8))[(long)local_378]._t1.
                  term._content;
          iVar28 = (*(UnificationConstraint **)((long)stack._M_head_impl + 8))[(long)local_378]._t1.
                   index;
          if (pSVar9->_cursor == pSVar9->_end) {
            ::Lib::Stack<Kernel::TermSpec>::expand(pSVar9);
          }
          stack._M_head_impl = local_1e0._M_head_impl;
          pTVar19 = pSVar9->_cursor;
          (pTVar19->term)._content = uVar2;
          pTVar19->index = iVar28;
          pSVar9->_cursor = pTVar19 + 1;
          lVar21 = CONCAT17(local_368[7],local_368._0_7_);
          lVar32 = *(long *)(lVar21 + 0x10);
          if (lVar32 != *(long *)(lVar21 + 8)) {
            do {
              *(long *)(lVar21 + 0x10) = lVar32 + -0x10;
              local_308._8_4_ = *(int *)(lVar32 + -8);
              local_308._0_7_ = (undefined7)*(undefined8 *)(lVar32 + -0x10);
              local_308[7] = (undefined1)((ulong)*(undefined8 *)(lVar32 + -0x10) >> 0x38);
              pTVar19 = RobSubstitution::derefBound(*(RobSubstitution **)this,(TermSpec *)local_308)
              ;
              this_00 = (Term *)(pTVar19->term)._content;
              if (((ulong)this_00 & 1) == 0) {
                pSVar9 = (Stack<Kernel::TermSpec> *)CONCAT17(local_368[7],local_368._0_7_);
                local_188 = Term::numTermArguments(this_00);
                uStack_190 = 0;
                it._iter._20_4_ = uStack_184;
                it._iter._inner._to = local_188;
                it._iter._inner._next = 0;
                it._iter._inner._from = 0;
                it._iter._func.this = pTVar19;
                local_198 = pTVar19;
                ::Lib::Stack<Kernel::TermSpec>::
                loadFromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Kernel::TermSpec::termArgs()const::_lambda(auto:1)_1_,Kernel::TermSpec>>>
                          (pSVar9,it);
              }
              else {
                ::Lib::
                DHMap<Kernel::TermSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
                insert((DHMap<Kernel::TermSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                        *)local_280._M_t.
                          super__Tuple_impl<0UL,_Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                          .
                          super__Head_base<0UL,_Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                          ._M_head_impl,this_00,pTVar19->index);
              }
              lVar21 = CONCAT17(local_368[7],local_368._0_7_);
              lVar32 = *(long *)(lVar21 + 0x10);
            } while (lVar32 != *(long *)(lVar21 + 8));
          }
          ::Lib::Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled((Recycled<Lib::Stack<Kernel::TermSpec>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)local_368);
          pKVar22 = local_1d0 + (local_1d0 < local_1d8);
          pKVar29 = local_1d0;
        } while (local_1d0 < local_1d8);
      }
      lVar21 = 1;
      lVar32 = 0;
      do {
        if (pKVar30 + lVar21 == (Kernel *)0x1) {
          local_2c8._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
               (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                  )0x0;
          local_2c8._8_8_ = 0;
          goto LAB_006193fc;
        }
        pEVar23 = ::Lib::
                  DHMap<Kernel::TermSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
                  findEntry((DHMap<Kernel::TermSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                             *)local_280._M_t.
                               super__Tuple_impl<0UL,_Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                               .
                               super__Head_base<0UL,_Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                               ._M_head_impl,
                            (TermSpec *)
                            ((long)&((*(UnificationConstraint **)((long)stack._M_head_impl + 8))->
                                    _t1).term._content + lVar32));
        lVar21 = lVar21 + -1;
        lVar32 = lVar32 + 0x30;
      } while (pEVar23 != (Entry *)0x0);
      local_2c8._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl._0_1_
           = 1;
      local_2c8._8_8_ = -lVar21;
LAB_006193fc:
      uVar12 = local_2c8._8_8_;
      if ((char)local_2c8._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                _M_head_impl == '\x01') {
        pUVar25 = *(UnificationConstraint **)((long)stack._M_head_impl + 8);
        IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)local_308,
                   (IntegerConstantType *)&pUVar25[local_2c8._8_8_]._t2);
        IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)(local_308 + 0x10),
                   (IntegerConstantType *)&pUVar25[uVar12]._sort);
        local_328._8_8_ = &local_2c8;
        local_368._0_7_ = SUB87((IntegerConstantType *)local_308,0);
        local_368[7] = (undefined1)((ulong)local_308 >> 0x38);
        local_368._8_8_ = local_370;
        local_368._16_7_ = SUB87(&local_240,0);
        uStack_351 = (undefined1)((ulong)&local_240 >> 0x38);
        uStack_350 = SUB87(*(UnificationConstraint **)((long)stack._M_head_impl + 8) +
                           local_2c8._8_8_,0);
        uStack_349 = (undefined1)
                     ((ulong)(*(UnificationConstraint **)((long)stack._M_head_impl + 8) +
                             local_2c8._8_8_) >> 0x38);
        uStack_348 = SUB87(&local_140,0);
        uStack_341 = (undefined1)((ulong)&local_140 >> 0x38);
        uStack_340 = SUB87(local_328,0);
        uStack_339 = (undefined1)((ulong)local_328 >> 0x38);
        local_328._0_8_ = stack._M_head_impl;
        alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
        ::{lambda(auto:1)#5}::operator()(&local_160);
        ::Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        ::Coproduct<Kernel::AbstractionOracle::EqualIf,_0>(local_380,&local_160);
        ::Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&local_160._constr);
        ::Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&local_160._unify);
        mpz_clear((__mpz_struct *)(local_308 + 0x10));
        mpz_clear((__mpz_struct *)local_308);
      }
      else {
        if (pKVar30 == (Kernel *)0x1) {
          pUVar25 = *(UnificationConstraint **)((long)stack._M_head_impl + 8);
          pUVar4 = *(UnificationConstraint **)((long)stack._M_head_impl + 8);
          IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)local_368,(IntegerConstantType *)&pUVar4->_t2);
          IntegerConstantType::IntegerConstantType
                    ((IntegerConstantType *)(local_368 + 0x10),(IntegerConstantType *)&pUVar4->_sort
                    );
          uVar26 = ((long)*(UnificationConstraint **)((long)stack._M_head_impl + 0x10) -
                    (long)*(UnificationConstraint **)((long)stack._M_head_impl + 8) >> 4) *
                   -0x5555555555555555;
          if (1 < uVar26) {
            uVar33 = (ulong)(1 < uVar26);
            uVar27 = 2;
            do {
              uVar2 = (pUVar25->_t1).term._content;
              local_308._8_4_ = (pUVar25->_t1).index;
              local_308._0_7_ = (undefined7)uVar2;
              local_308[7] = (undefined1)(uVar2 >> 0x38);
              bVar17 = uncanellableOccursCheck
                                 ((AbstractingUnifier *)this,(VarSpec *)local_308,
                                  &(*(UnificationConstraint **)((long)stack._M_head_impl + 8))
                                   [uVar33]._t1);
              if (bVar17) {
                pDVar11 = &(local_380->_inner).
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
                ;
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0xf] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x10] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x11] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x12] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x13] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x14] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x15] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x16] = '\0';
                pDVar11 = &(local_380->_inner).
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
                ;
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x17] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x18] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x19] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x1a] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x1b] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x1c] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x1d] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0x1e] = '\0';
                *(undefined8 *)
                 &(local_380->_inner).
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
                  .
                  super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                     = 0;
                pDVar11 = &(local_380->_inner).
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
                ;
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[7] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[8] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[9] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[10] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0xb] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0xc] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0xd] = '\0';
                (pDVar11->
                super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                )._content[0xe] = '\0';
                *(undefined4 *)
                 ((local_380->_inner).
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
                  .
                  super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
                  ._content + 0x1f) = 0;
                RationalConstantType::~RationalConstantType((RationalConstantType *)local_368);
                goto LAB_006198cc;
              }
              bVar17 = uVar27 < uVar26;
              if (bVar17) {
                uVar33 = uVar27;
              }
              uVar27 = uVar27 + 1;
            } while (bVar17);
          }
          mpz_clear((__mpz_struct *)(local_368 + 0x10));
          mpz_clear((__mpz_struct *)local_368);
        }
        if (*(char *)local_370 == '\x01') {
          AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_308);
          if (*(char *)&(((Self *)local_370)->_M_t).
                        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
              == '\x01') {
            *(char *)&(((Self *)local_370)->_M_t).
                      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> =
                 '\0';
            ppVar31 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                       ((long)local_370 + 8);
            uStack_341 = SUB81(((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *
                                )((long)local_370 + 0x20))->_stack,0);
            uStack_340 = (undefined7)
                         ((ulong)((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>
                                   *)((long)local_370 + 0x20))->_stack >> 8);
            uStack_339 = SUB81(((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *
                                )((long)local_370 + 0x20))->_cursor,0);
            uStack_338 = (undefined7)
                         ((ulong)((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>
                                   *)((long)local_370 + 0x20))->_cursor >> 8);
            uStack_351 = SUB81(*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                                ((long)local_370 + 0x18),0);
            uStack_350 = (undefined7)
                         ((ulong)*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                                  ((long)local_370 + 0x18) >> 8);
            uStack_349 = (undefined1)
                         ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                         ((long)local_370 + 0x20))->_capacity;
            uStack_348 = (undefined7)
                         (((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                          ((long)local_370 + 0x20))->_capacity >> 8);
            local_368[7] = SUB81(ppVar31,0);
            local_368._8_4_ = (undefined4)((ulong)ppVar31 >> 8);
            local_368._12_3_ = (undefined3)((ulong)ppVar31 >> 0x28);
            local_368[0xf] =
                 SUB81(*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                        ((long)local_370 + 0x10),0);
            local_368._16_7_ =
                 (undefined7)
                 ((ulong)*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                          ((long)local_370 + 0x10) >> 8);
          }
          else {
            *(char *)&(((Self *)local_370)->_M_t).
                      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false> =
                 '\0';
          }
          pSVar10 = (Stack<Kernel::UnificationConstraint> *)CONCAT17(local_308[7],local_308._0_7_);
          ::Lib::Stack<Kernel::UnificationConstraint>::reserve
                    (pSVar10,((long)pSVar10->_cursor - (long)pSVar10->_stack >> 4) *
                             -0x5555555555555555 + 1);
          if (pSVar10->_cursor == pSVar10->_end) {
            ::Lib::Stack<Kernel::UnificationConstraint>::expand(pSVar10);
          }
          pUVar25 = pSVar10->_cursor;
          (pUVar25->_sort).term._content = CONCAT71(uStack_340,uStack_341);
          *(ulong *)&(pUVar25->_sort).index = CONCAT71(uStack_338,uStack_339);
          (pUVar25->_t2).term._content = CONCAT71(uStack_350,uStack_351);
          *(ulong *)&(pUVar25->_t2).index = CONCAT71(uStack_348,uStack_349);
          (pUVar25->_t1).term._content =
               CONCAT35(local_368._12_3_,CONCAT41(local_368._8_4_,local_368[7]));
          *(ulong *)&(pUVar25->_t1).index = CONCAT71(local_368._16_7_,local_368[0xf]);
          pSVar10->_cursor = pSVar10->_cursor + 1;
          local_328[7] = local_308[7];
          local_328._0_7_ = local_308._0_7_;
          local_318._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl.
          _7_1_ = local_308[0x17];
          local_318._self._M_t.
          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl.
          _0_7_ = local_308._16_7_;
          local_308._0_7_ = 0;
          local_308[7] = 0;
          local_308._16_7_ = 0;
          local_308[0x17] = 0;
          ::Lib::
          Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)(local_308 + 0x10));
          ::Lib::
          Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)local_308);
        }
        else {
          AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_328);
        }
        alasca<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::AbstractingUnifier&,Kernel::TermSpec_const&,Kernel::TermSpec_const&,Kernel::NumTraits<Kernel::RationalConstantType>,Shell::Options::UnificationWithAbstraction)
        ::{lambda(auto:1&)#1}::operator()
                  (&local_90,(_lambda_auto_1___1_ *)&local_1a8,
                   (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                   stack._M_head_impl);
        SVar13._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )local_318._self;
        uStack_348 = (undefined7)local_90._sort.term._content;
        uStack_341 = (undefined1)(local_90._sort.term._content >> 0x38);
        uStack_340 = local_90._sort._8_7_;
        uStack_339 = local_90._sort._15_1_;
        local_368._16_7_ = (undefined7)local_90._t2.term._content;
        uStack_351 = (undefined1)(local_90._t2.term._content >> 0x38);
        uStack_350 = local_90._t2._8_7_;
        uStack_349 = local_90._t2._15_1_;
        local_368._0_7_ = (undefined7)local_90._t1.term._content;
        local_368[7] = (undefined1)(local_90._t1.term._content >> 0x38);
        local_368._8_4_ = local_90._t1.index;
        local_368._12_4_ = local_90._t1._12_4_;
        ::Lib::Stack<Kernel::UnificationConstraint>::reserve
                  ((Stack<Kernel::UnificationConstraint> *)
                   local_318._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                   _M_head_impl,
                   ((long)*(UnificationConstraint **)
                           ((long)local_318._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                                  ._M_head_impl + 0x10) -
                    (long)*(UnificationConstraint **)
                           ((long)local_318._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                                  .
                                  super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                                  ._M_head_impl + 8) >> 4) * -0x5555555555555555 + 1);
        if (*(UnificationConstraint **)
             ((long)SVar13._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                    _M_head_impl + 0x10) ==
            *(UnificationConstraint **)
             ((long)SVar13._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                    _M_head_impl + 0x18)) {
          ::Lib::Stack<Kernel::UnificationConstraint>::expand
                    ((Stack<Kernel::UnificationConstraint> *)
                     SVar13._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                     _M_head_impl);
        }
        pUVar25 = *(UnificationConstraint **)
                   ((long)SVar13._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>
                          ._M_head_impl + 0x10);
        (pUVar25->_sort).term._content = CONCAT17(uStack_341,uStack_348);
        *(ulong *)&(pUVar25->_sort).index = CONCAT17(uStack_339,uStack_340);
        (pUVar25->_t2).term._content = CONCAT17(uStack_351,local_368._16_7_);
        *(ulong *)&(pUVar25->_t2).index = CONCAT17(uStack_349,uStack_350);
        (pUVar25->_t1).term._content = CONCAT17(local_368[7],local_368._0_7_);
        *(ulong *)&(pUVar25->_t1).index = CONCAT44(local_368._12_4_,local_368._8_4_);
        *(UnificationConstraint **)
         ((long)SVar13._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                _M_head_impl + 0x10) =
             *(UnificationConstraint **)
              ((long)SVar13._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                     _M_head_impl + 0x10) + 1;
        local_100._unify._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )local_328._0_8_;
        local_328._0_8_ =
             (__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
        local_100._constr._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             local_318._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
        ;
        local_318._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                )0x0;
        ::Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        ::Coproduct<Kernel::AbstractionOracle::EqualIf,_0>(local_380,&local_100);
        ::Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&local_100._constr);
        ::Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&local_100._unify);
        ::Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&local_318);
        ::Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     *)local_328);
      }
LAB_006198cc:
      ::Lib::
      Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::DHSet<Kernel::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&local_280);
      goto LAB_00619b3b;
    }
    ::Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::Recycled(&local_228._unify);
    ::Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::Recycled(&local_238);
    iVar28 = *(int *)(((*(UnificationConstraint **)
                         ((long)local_130._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                .
                                super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                ._M_head_impl + 8))->_t1).term._content + 8);
    ::Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::Recycled(&local_250);
    ::Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::Recycled(&local_260);
    local_378 = this;
    RationalConstantType::RationalConstantType((RationalConstantType *)&local_280,0);
    local_368._0_7_ = SUB87((RationalConstantType *)&local_280,0);
    local_368[7] = (undefined1)((ulong)&local_280 >> 0x38);
    local_368._8_8_ = &local_260;
    siglen = &local_250;
    local_368._16_7_ = SUB87(siglen,0);
    uStack_351 = (undefined1)((ulong)siglen >> 0x38);
    uStack_350 = SUB87(&local_228,0);
    uStack_349 = (undefined1)((ulong)&local_228 >> 0x38);
    uStack_348 = SUB87(&local_381,0);
    uStack_341 = (undefined1)((ulong)&local_381 >> 0x38);
    uStack_340 = SUB87(&local_238,0);
    uStack_339 = (undefined1)((ulong)&local_238 >> 0x38);
    uStack_338 = SUB87(&local_140,0);
    uStack_331 = (undefined1)((ulong)&local_140 >> 0x38);
    pUVar4 = *(UnificationConstraint **)
              ((long)local_130._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                     ._M_head_impl + 0x10);
    for (pUVar25 = *(UnificationConstraint **)
                    ((long)local_130._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                           .
                           super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                           ._M_head_impl + 8); pUVar25 != pUVar4; pUVar25 = pUVar25 + 1) {
      pTVar19 = RobSubstitution::derefBound(*(RobSubstitution **)local_378,&pUVar25->_t1);
      iVar18 = *(int *)((pTVar19->term)._content + 8);
      if (iVar18 == iVar28) {
LAB_006192f4:
        r = (RationalConstantType *)&pUVar25->_t2;
        ctx = (EVP_PKEY_CTX *)r;
        RationalConstantType::operator+=((RationalConstantType *)&local_280,r);
        iVar18 = RationalConstantType::sign(r,ctx,sig_00,(size_t *)siglen,tbs,uVar26);
        pRVar24 = &local_260;
        if ((char)iVar18 == '\x01') {
          pRVar24 = &local_250;
        }
        this_01.
        super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
        ._M_head_impl =
             (pRVar24->_self)._M_t.
             super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
        ;
        std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>::pair
                  (&local_c0,(pair<Kernel::TermSpec,_Kernel::RationalConstantType> *)pUVar25);
        if (*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
             ((long)this_01.
                    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                    ._M_head_impl + 0x10) ==
            *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
             ((long)this_01.
                    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                    ._M_head_impl + 0x18)) {
          ::Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>::expand
                    ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
                     this_01.
                     super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                     ._M_head_impl);
        }
        std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>::pair
                  (*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                    ((long)this_01.
                           super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                           ._M_head_impl + 0x10),&local_c0);
        *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
         ((long)this_01.
                super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                ._M_head_impl + 0x10) =
             *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
              ((long)this_01.
                     super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                     ._M_head_impl + 0x10) + 1;
        mpz_clear(local_c0.second._den._val);
        bVar17 = true;
        mpz_clear((__mpz_struct *)&local_c0.second);
      }
      else {
        bVar17 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_56_7_29367afc
                 ::operator()((anon_class_56_7_29367afc *)local_368);
        if (bVar17) {
          RationalConstantType::RationalConstantType((RationalConstantType *)local_308,0);
          mpz_swap((__mpz_struct *)&local_280,(__mpz_struct *)local_308);
          mpz_swap(&local_270,(__mpz_struct *)(local_308 + 0x10));
          mpz_clear((__mpz_struct *)(local_308 + 0x10));
          mpz_clear((__mpz_struct *)local_308);
          SVar15._M_t.
          super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
          .
          super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
          ._M_head_impl =
               local_250._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
               .
               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
               ._M_head_impl;
          for (ppVar31 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                          ((long)local_250._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 .
                                 super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                 ._M_head_impl + 0x10);
              SVar14._M_t.
              super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>,_true,_true>
                    )(__uniq_ptr_data<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>,_true,_true>
                      )local_260._self,
              ppVar3 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                        ((long)SVar15._M_t.
                               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                               .
                               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                               ._M_head_impl + 8), ppVar31 != ppVar3; ppVar31 = ppVar31 + -1) {
            mpz_clear(ppVar31[-1].second._den._val);
            mpz_clear((__mpz_struct *)&ppVar31[-1].second);
          }
          *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
           ((long)SVar15._M_t.
                  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                  ._M_head_impl + 0x10) = ppVar3;
          for (ppVar31 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                          ((long)local_260._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                                 .
                                 super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                 ._M_head_impl + 0x10);
              ppVar3 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                        ((long)SVar14._M_t.
                               super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                               .
                               super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                               ._M_head_impl + 8), ppVar31 != ppVar3; ppVar31 = ppVar31 + -1) {
            mpz_clear(ppVar31[-1].second._den._val);
            mpz_clear((__mpz_struct *)&ppVar31[-1].second);
          }
          *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
           ((long)SVar14._M_t.
                  super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
                  .
                  super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                  ._M_head_impl + 0x10) = ppVar3;
          iVar28 = iVar18;
          goto LAB_006192f4;
        }
        pDVar11 = &(local_380->_inner).
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xf] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x10] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x11] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x12] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x13] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x14] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x15] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x16] = '\0';
        pDVar11 = &(local_380->_inner).
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x17] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x18] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x19] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1a] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1b] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1c] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1d] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0x1e] = '\0';
        *(undefined8 *)
         &(local_380->_inner).
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          .
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
             = 0;
        pDVar11 = &(local_380->_inner).
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        ;
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[7] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[8] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[9] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[10] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xb] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xc] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xd] = '\0';
        (pDVar11->
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        )._content[0xe] = '\0';
        *(undefined4 *)
         ((local_380->_inner).
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
          .
          super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
          ._content + 0x1f) = 0;
        bVar17 = false;
      }
      if (!bVar17) goto LAB_00619aed;
    }
    bVar17 = alasca<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_56_7_29367afc::
             operator()((anon_class_56_7_29367afc *)local_368);
    if (bVar17) {
      if (*(char *)local_370 == '\x01') {
        AbstractionOracle::EqualIf::EqualIf((EqualIf *)local_328);
        uVar12 = local_328._0_8_;
        if (*(char *)local_370 == '\x01') {
          *(char *)local_370 = '\0';
          ppVar31 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)((long)local_370 + 8);
          local_308._31_8_ =
               ((Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
               ((long)local_370 + 0x20))->_capacity;
          local_2e1 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                       ((long)local_370 + 0x28);
          ppStack_2d9 = *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                         ((long)local_370 + 0x30);
          local_308[0x17] =
               SUB81(*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                      ((long)local_370 + 0x18),0);
          local_308._24_7_ =
               (undefined7)
               ((ulong)*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                        ((long)local_370 + 0x18) >> 8);
          local_308[7] = SUB81(ppVar31,0);
          local_308._8_4_ = (undefined4)((ulong)ppVar31 >> 8);
          local_308._12_3_ = (undefined3)((ulong)ppVar31 >> 0x28);
          local_308[0xf] =
               SUB81(*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                      ((long)local_370 + 0x10),0);
          local_308._16_7_ =
               (undefined7)
               ((ulong)*(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)
                        ((long)local_370 + 0x10) >> 8);
        }
        else {
          *(char *)local_370 = '\0';
        }
        ::Lib::Stack<Kernel::UnificationConstraint>::reserve
                  ((Stack<Kernel::UnificationConstraint> *)local_328._0_8_,
                   ((long)*(UnificationConstraint **)(local_328._0_8_ + 0x10) -
                    (long)*(UnificationConstraint **)(local_328._0_8_ + 8) >> 4) *
                   -0x5555555555555555 + 1);
        if (*(UnificationConstraint **)(uVar12 + 0x10) == *(UnificationConstraint **)(uVar12 + 0x18)
           ) {
          ::Lib::Stack<Kernel::UnificationConstraint>::expand
                    ((Stack<Kernel::UnificationConstraint> *)uVar12);
        }
        pUVar25 = *(UnificationConstraint **)(uVar12 + 0x10);
        (pUVar25->_sort).term._content = (uint64_t)local_2e1;
        *(pair<Kernel::TermSpec,_Kernel::RationalConstantType> **)&(pUVar25->_sort).index =
             ppStack_2d9;
        (pUVar25->_t2).term._content = CONCAT71(local_308._24_7_,local_308[0x17]);
        *(undefined8 *)&(pUVar25->_t2).index = local_308._31_8_;
        (pUVar25->_t1).term._content =
             CONCAT35(local_308._12_3_,CONCAT41(local_308._8_4_,local_308[7]));
        *(ulong *)&(pUVar25->_t1).index = CONCAT71(local_308._16_7_,local_308[0xf]);
        *(UnificationConstraint **)(uVar12 + 0x10) = *(UnificationConstraint **)(uVar12 + 0x10) + 1;
        local_2a0._unify._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
                )local_328._0_8_;
        local_328._0_8_ =
             (_Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
        local_2a0._constr._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             local_318._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
        ;
        local_318._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                )0x0;
        ::Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&local_318);
        ::Lib::
        Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                     *)local_328);
      }
      else {
        AbstractionOracle::EqualIf::EqualIf(&local_2a0);
      }
      SVar16._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )local_228._unify._self;
      SVar13._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           local_2a0._unify._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
      local_228._unify._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_170._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_2a0._unify._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           SVar16._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
      if ((tuple<Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           )SVar13._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
          != (_Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>)0x0) {
        std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>::operator()
                  ((default_delete<Lib::Stack<Kernel::UnificationConstraint>_> *)&local_2a0,
                   (Stack<Kernel::UnificationConstraint> *)
                   SVar13._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                   _M_head_impl);
      }
      local_2b8._M_head_impl =
           (Stack<Kernel::UnificationConstraint> *)
           local_238._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
      SVar13._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )local_2a0._constr._self;
      local_2c8._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           local_2a0._unify._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
      local_2a0._unify._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_2a0._constr._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_238._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_180._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      if ((_Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           )SVar13._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl
          != (Stack<Kernel::UnificationConstraint> *)0x0) {
        std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>::operator()
                  ((default_delete<Lib::Stack<Kernel::UnificationConstraint>_> *)&local_2b8,
                   (Stack<Kernel::UnificationConstraint> *)
                   SVar13._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>.
                   _M_head_impl);
      }
      local_120._unify._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           local_2c8._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl;
      local_2c8._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
              )0x0;
      local_120._constr._self._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::UnificationConstraint>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::UnificationConstraint>,_std::default_delete<Lib::Stack<Kernel::UnificationConstraint>_>,_true,_true>
              )local_2b8._M_head_impl;
      local_2b8._M_head_impl = (Stack<Kernel::UnificationConstraint> *)0x0;
      ::Lib::Coproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>::
      Coproduct<Kernel::AbstractionOracle::EqualIf,_0>(local_380,&local_120);
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_120._constr);
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_120._unify);
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_180);
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&local_2b8);
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_2c8);
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_170);
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_2a0._constr);
      ::Lib::
      Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_2a0._unify);
    }
    else {
      pDVar11 = &(local_380->_inner).
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
      ;
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xf] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x10] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x11] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x12] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x13] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x14] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x15] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x16] = '\0';
      pDVar11 = &(local_380->_inner).
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
      ;
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x17] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x18] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x19] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1a] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1b] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1c] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1d] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0x1e] = '\0';
      *(undefined8 *)
       &(local_380->_inner).
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        .
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
           = 0;
      pDVar11 = &(local_380->_inner).
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
      ;
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[7] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[8] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[9] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[10] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xb] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xc] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xd] = '\0';
      (pDVar11->
      super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>)
      ._content[0xe] = '\0';
      *(undefined4 *)
       ((local_380->_inner).
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>_>
        .
        super_RawCoproduct<Kernel::AbstractionOracle::NeverEqual,_Kernel::AbstractionOracle::EqualIf>
        ._content + 0x1f) = 0;
    }
LAB_00619aed:
    mpz_clear(&local_270);
    mpz_clear((__mpz_struct *)&local_280);
    ::Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_260);
    ::Lib::
    Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_250);
    ::Lib::
    Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_238);
    this_02 = &local_228;
  }
  ::Lib::
  Recycled<Lib::Stack<Kernel::UnificationConstraint>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&this_02->_unify);
LAB_00619b3b:
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_130);
  return local_380;
}

Assistant:

AbstractionOracle::AbstractionResult alasca(AbstractingUnifier& au, TermSpec const& t1, TermSpec const& t2, NumTraits n_, Options::UnificationWithAbstraction uwa) {
  TIME_TRACE("unification with abstraction ALASCA")
  AlascaSignature<NumTraits> sig;
  Option<UnificationConstraint> sortsUnif;
  auto equalIf = [&]() {
    if (sortsUnif.isSome()) {
      return AbstractionOracle::EqualIf()
                     .unify(*sortsUnif.take());
    } else {
      return AbstractionOracle::EqualIf();
    }
  };
  using AbstractionResult = AbstractionOracle::AbstractionResult;
  using NeverEqual = AbstractionOracle::NeverEqual;
  using Numeral = typename NumTraits::ConstantType;
  
  auto cTerm = [&](auto... args) { return au.subs().createTerm(args...); };
  auto constraint = [&](auto lhs, auto rhs) { return UnificationConstraint(lhs, rhs, TermSpec(sig.sort(), 0)); };

#define CHECK_SORTS(t1, t2)                                                               \
  if (t1.isTerm()) {                                                                      \
    auto s1 = au.subs().derefBound(t1.sort());                                            \
    if (s1.isVar()) {                                                                     \
      ASS(sortsUnif.isNone())                                                             \
      sortsUnif = some(UnificationConstraint(s1, TermSpec(sig.sort(), 0), TermSpec(AtomicSort::superSort(), 0))); \
    } else if (s1.term != sig.sort()) {                                                   \
      return AbstractionResult(NeverEqual{});                                             \
    }                                                                                     \
  }                                                                                       \

  CHECK_SORTS(t1, t2)
  CHECK_SORTS(t2, t1)

  Recycled<Stack<std::pair<TermSpec, Numeral>>> _diff;
  auto& diff = *_diff;
  // TODO prevent these cterm calls?
  auto dt = cTerm(sig.addF(), cTerm(sig.minusF(), t1), t2);
  auto nf = norm(std::move(dt), au);

  iterAtoms(std::move(nf), au, sig,
    [&diff](auto t, auto num) { diff.push(std::make_pair(t,  num)); });

  // TODO bin search if many elems
  auto nVars = range(0, diff.size())
    .find([&](auto i) { return !diff[i].first.isVar();  })
    .unwrapOrElse([&](){ return diff.size(); });

  ASS(nVars == 0 || diff[nVars - 1].first.isVar())
  ASS(nVars == diff.size() || !diff[nVars].first.isVar())

  auto sum = [&](auto iter) -> TermSpec {
      return iterTraits(std::move(iter))
        .map([&](auto x) { return numMul(x.second, std::move(x.first)); })
        .fold([&](auto l, auto r) 
          { return cTerm(sig.addF(), std::move(l), std::move(r)); })
        .unwrapOrElse([&]() { return TermSpec(sig.numeralTl(Numeral(0)), 0); }); };

  auto toConstr = [&](auto& stack) {
    return constraint(
              sum(arrayIter(stack)
                 .filter([](auto& x) { return x.second.isPositive(); })
                 .map([](auto& x) { return std::make_pair(std::move(std::move(x.first)), x.second); })),
              sum(arrayIter(stack)
                 .filter([](auto& x) { return !x.second.isPositive(); })
                 .map([](auto& x) { return std::make_pair(std::move(x.first), -x.second); })));
  };

  if (arrayIter(diff).any([&](auto& x) 
        { return x.first.isTerm() && NumTraits::isMul(x.first.functor()); })) {

    // non-linear multiplication. we cannot deal with this in alasca
    return AbstractionResult(equalIf().constr(toConstr(diff)));

  } else if (diff.size() == 0) {
    return AbstractionResult(equalIf());

  } else if (nVars > 0) {
     Recycled<DHSet<TermSpec>> shieldedVars;
     for (auto i : range(nVars, diff.size())) {
       Recycled<Stack<TermSpec>> todo;
       todo->push(diff[i].first);
       while (todo->isNonEmpty()) {
         auto next_ = todo->pop();
         auto& next = au.subs().derefBound(next_);
         if (next.isVar()) {
           shieldedVars->insert(next);
         } else {
           todo->loadFromIterator(next.termArgs());
         }
       }
     }
     auto idx = 
       range(0, nVars)
          .find([&](auto i) 
                { return !shieldedVars->contains(diff[i].first); });

    if (idx) {
      // we have a variable unshielded in this unification
      auto num = diff[*idx].second;
      auto& var = diff[*idx].first;
      auto rest = [&]() 
      { return range(0, diff.size())
                .filter([&](auto i) { return i != *idx; })
                .map([&](auto i) { return std::move(diff[i]); }); };

      return AbstractionResult(ifIntTraits(NumTraits{}, 
            // TODO
            [&](auto n) { return num == -1 ? equalIf().unify(constraint(std::move(var), sum(rest())))
                               : num ==  1 ? equalIf().unify(constraint(std::move(var), sum(rest().map([](auto x) { return std::make_pair(std::move(x.first), -std::move(x.second)); }))))
                               :                      equalIf().constr(constraint(numMul(-num, std::move(var)), sum(rest())))
                                                    ; },
            [&](auto n) { return equalIf().unify(constraint(std::move(var), 
                sum(rest().map([&](auto x) { return std::make_pair(std::move(x.first), divOrPanic(n, x.second, -num)); })
                  ))); }
            ));

    } else {
      // all variables are shielded

      if (nVars == 1) {
       auto& var = diff[0].first;
       auto  num = diff[0].second;

       for (auto i : range(nVars, diff.size())) {
         if (uncanellableOccursCheck(au, var.varSpec(), diff[i].first)) {
           return AbstractionResult(NeverEqual{});
         }
       }
     }
     return AbstractionResult(equalIf().constr(toConstr(diff)));
    }
  } 

  // no variables

  Recycled<Stack<UnificationConstraint>> unify;
  Recycled<Stack<UnificationConstraint>> constr;
  auto curF = diff[0].first.functor();
  Recycled<Stack<std::pair<TermSpec, Numeral>>> curPosSummands;
  Recycled<Stack<std::pair<TermSpec, Numeral>>> curNegSummands;
  auto curSum = Numeral(0);  


  auto curSumCanUnify = [&]() -> bool {
      if (curSum != Numeral(0)) {
        return false;

      } else if (curNegSummands->size() == 1) {
        for (auto& s : *curPosSummands) {
          unify->push(UnificationConstraint(
            (*curNegSummands)[0].first,
            std::move(s.first), 
            TermSpec(sig.sort(), 0)));
        }
        return true;

      } else if (curPosSummands->size() == 1) {
        for (auto& s : *curNegSummands) {
          unify->push(UnificationConstraint(
            (*curPosSummands)[0].first,
            std::move(s.first),
            TermSpec(sig.sort(), 0)));
        }
        return true;

      } else {
        ASS(curPosSummands->size() + curNegSummands->size() >= 3)
        constr->push(UnificationConstraint(
              sum(arrayIter(*curPosSummands)
                 .map([](auto& x) { return std::make_pair(std::move(x.first), x.second); })),
              sum(arrayIter(*curNegSummands)
                 .map([](auto& x) { return std::make_pair(std::move(x.first), -x.second); })),
              TermSpec(sig.sort(), 0)));
        return true;
      }
  };

  for (auto& x : diff) {
    auto f = au.subs().derefBound(x.first).functor();
    if (f != curF) {
      if (!curSumCanUnify()) { return AbstractionResult(NeverEqual{});}
      curF = f;
      curSum = Numeral(0);
      curPosSummands->reset();
      curNegSummands->reset();
    }
    curSum += x.second;
    (x.second.isPositive() ? curPosSummands : curNegSummands)->push(std::move(x));
  }
  if (!curSumCanUnify()) { return AbstractionResult(NeverEqual{});}
  return AbstractionResult(equalIf().unify(std::move(unify)).constr(std::move(constr)));
}